

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayQueryFunction::DimResult::DimResult(DimResult *this,ConstantRange range)

{
  undefined8 in_RSI;
  AssociativeArray *in_RDI;
  
  AssociativeArray::AssociativeArray(in_RDI);
  *(undefined8 *)
   &in_RDI[1].
    super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &in_RDI[1].
    super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = in_RSI;
  *(undefined1 *)
   &in_RDI[1].
    super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].
           super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].
           super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 2) = 0;
  return;
}

Assistant:

DimResult(ConstantRange range) : range(range) {}